

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::advance_past_space_character
          (jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = this->p_;
  cVar1 = *pcVar2;
  if (cVar1 == ' ') {
LAB_00373145:
    this->p_ = pcVar2 + 1;
    this->column_ = this->column_ + 1;
    return;
  }
  if (cVar1 != '\n') {
    if (cVar1 != '\r') {
      if (cVar1 != '\t') {
        return;
      }
      goto LAB_00373145;
    }
    if ((pcVar2 + 1 < this->end_input_) && (pcVar2[1] == '\n')) {
      pcVar2 = pcVar2 + 1;
    }
  }
  this->line_ = this->line_ + 1;
  this->column_ = 1;
  this->p_ = pcVar2 + 1;
  return;
}

Assistant:

void advance_past_space_character()
        {
            switch (*p_)
            {
                case ' ':case '\t':
                    ++p_;
                    ++column_;
                    break;
                case '\r':
                    if (p_+1 < end_input_ && *(p_+1) == '\n')
                    {
                        ++p_;
                    }
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                case '\n':
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                default:
                    break;
            }
        }